

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * mult(Bigint *a,Bigint *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32 *puVar4;
  ulong uVar5;
  uint32 *puVar6;
  bool bVar7;
  uint64 z;
  uint64 carry;
  uint32 *puStack_70;
  uint32 y;
  uint32 *xc0;
  uint32 *xc;
  uint32 *xbe;
  uint32 *xb;
  uint32 *xae;
  uint32 *xa;
  uint32 *x;
  int wc;
  int wb;
  int wa;
  int k;
  Bigint *c;
  Bigint *b_local;
  Bigint *a_local;
  
  if (((a->x[0] == 0) && (a->wds == 1)) || ((b->x[0] == 0 && (b->wds == 1)))) {
    a_local = Balloc(0);
    if (a_local == (Bigint *)0x0) {
      a_local = (Bigint *)0x0;
    }
    else {
      a_local->wds = 1;
      a_local->x[0] = 0;
    }
  }
  else {
    c = b;
    b_local = a;
    if (a->wds < b->wds) {
      c = a;
      b_local = b;
    }
    wb = b_local->k;
    iVar1 = b_local->wds;
    iVar2 = c->wds;
    x._0_4_ = iVar1 + iVar2;
    if (b_local->maxwds < (int)x) {
      wb = wb + 1;
    }
    a_local = Balloc(wb);
    if (a_local == (Bigint *)0x0) {
      a_local = (Bigint *)0x0;
    }
    else {
      xa = a_local->x;
      puVar4 = xa + (int)x;
      for (; xa < puVar4; xa = xa + 1) {
        *xa = 0;
      }
      puStack_70 = a_local->x;
      xbe = c->x;
      while (xbe < c->x + iVar2) {
        uVar3 = *xbe;
        if (uVar3 != 0) {
          xc0 = puStack_70;
          z = 0;
          xa = b_local->x;
          do {
            puVar4 = xa + 1;
            uVar5 = (ulong)*xa * (ulong)uVar3 + (ulong)*xc0 + z;
            z = uVar5 >> 0x20;
            puVar6 = xc0 + 1;
            *xc0 = (uint32)uVar5;
            xc0 = puVar6;
            xa = puVar4;
          } while (puVar4 < b_local->x + iVar1);
          *puVar6 = (uint32)(uVar5 >> 0x20);
        }
        puStack_70 = puStack_70 + 1;
        xbe = xbe + 1;
      }
      xc0 = a_local->x + (int)x;
      while( true ) {
        bVar7 = false;
        if (0 < (int)x) {
          bVar7 = xc0[-1] == 0;
          xc0 = xc0 + -1;
        }
        if (!bVar7) break;
        x._0_4_ = (int)x + -1;
      }
      a_local->wds = (int)x;
    }
  }
  return a_local;
}

Assistant:

static Bigint *
mult(Bigint *a, Bigint *b)
{
    Bigint *c;
    int k, wa, wb, wc;
    ULong *x, *xa, *xae, *xb, *xbe, *xc, *xc0;
    ULong y;
#ifdef ULLong
    ULLong carry, z;
#else
    ULong carry, z;
    ULong z2;
#endif

    if ((!a->x[0] && a->wds == 1) || (!b->x[0] && b->wds == 1)) {
        c = Balloc(0);
        if (c == NULL)
            return NULL;
        c->wds = 1;
        c->x[0] = 0;
        return c;
    }

    if (a->wds < b->wds) {
        c = a;
        a = b;
        b = c;
    }
    k = a->k;
    wa = a->wds;
    wb = b->wds;
    wc = wa + wb;
    if (wc > a->maxwds)
        k++;
    c = Balloc(k);
    if (c == NULL)
        return NULL;
    for(x = c->x, xa = x + wc; x < xa; x++)
        *x = 0;
    xa = a->x;
    xae = xa + wa;
    xb = b->x;
    xbe = xb + wb;
    xc0 = c->x;
#ifdef ULLong
    for(; xb < xbe; xc0++) {
        if ((y = *xb++)) {
            x = xa;
            xc = xc0;
            carry = 0;
            do {
                z = *x++ * (ULLong)y + *xc + carry;
                carry = z >> 32;
                *xc++ = (ULong)(z & FFFFFFFF);
            }
            while(x < xae);
            *xc = (ULong)carry;
        }
    }
#else
    for(; xb < xbe; xb++, xc0++) {
        if (y = *xb & 0xffff) {
            x = xa;
            xc = xc0;
            carry = 0;
            do {
                z = (*x & 0xffff) * y + (*xc & 0xffff) + carry;
                carry = z >> 16;
                z2 = (*x++ >> 16) * y + (*xc >> 16) + carry;
                carry = z2 >> 16;
                Storeinc(xc, z2, z);
            }
            while(x < xae);
            *xc = carry;
        }
        if (y = *xb >> 16) {
            x = xa;
            xc = xc0;
            carry = 0;
            z2 = *xc;
            do {
                z = (*x & 0xffff) * y + (*xc >> 16) + carry;
                carry = z >> 16;
                Storeinc(xc, z, z2);
                z2 = (*x++ >> 16) * y + (*xc & 0xffff) + carry;
                carry = z2 >> 16;
            }
            while(x < xae);
            *xc = z2;
        }
    }
#endif
    for(xc0 = c->x, xc = xc0 + wc; wc > 0 && !*--xc; --wc) ;
    c->wds = wc;
    return c;
}